

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QGraphicsItem_*>::swapItemsAt(QList<QGraphicsItem_*> *this,qsizetype i,qsizetype j)

{
  QGraphicsItem **ppQVar1;
  QGraphicsItem *pQVar2;
  
  detach(this);
  ppQVar1 = (this->d).ptr;
  pQVar2 = ppQVar1[i];
  ppQVar1[i] = ppQVar1[j];
  ppQVar1[j] = pQVar2;
  return;
}

Assistant:

void swapItemsAt(qsizetype i, qsizetype j) {
        Q_ASSERT_X(i >= 0 && i < size() && j >= 0 && j < size(),
                    "QList<T>::swap", "index out of range");
        detach();
        qSwap(d->begin()[i], d->begin()[j]);
    }